

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t width_;
  uint32_t height_;
  uint32_t uVar4;
  uint32_t uVar5;
  const_reference pvVar6;
  code *in_RDI;
  Image output;
  uint8_t channelId;
  Image input;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  bool local_f6;
  uint32_t in_stack_ffffffffffffff0c;
  undefined2 in_stack_ffffffffffffff14;
  uint8_t in_stack_ffffffffffffff16;
  uint8_t in_stack_ffffffffffffff17;
  byte colorCount_;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  ImageTemplate<unsigned_char> *this;
  value_type value;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff58;
  uint32_t in_stack_ffffffffffffff60;
  uint32_t in_stack_ffffffffffffff64;
  uint32_t in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff6c;
  Image *in_stack_ffffffffffffff70;
  ImageTemplate<unsigned_char> local_48;
  code *local_8;
  
  this = (ImageTemplate<unsigned_char> *)&stack0xffffffffffffffe0;
  local_8 = in_RDI;
  Unit_Test::intensityArray(in_stack_ffffffffffffff0c);
  pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,0);
  value = *pvVar6;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (this,in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18,in_stack_ffffffffffffff17,
             in_stack_ffffffffffffff16);
  Test_Helper::uniformRGBImage(value,this);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2d77);
  width_ = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  height_ = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff64,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  bVar1 = Test_Helper::randomValue<unsigned_char>(0x1d2dcb);
  colorCount_ = bVar1;
  uVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::width(&local_48);
  uVar5 = PenguinV_Image::ImageTemplate<unsigned_char>::height(&local_48);
  uVar3 = (uint8_t)(uVar5 >> 0x18);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (this,width_,height_,colorCount_,in_stack_ffffffffffffff16);
  Test_Helper::uniformImage
            (width_,height_,
             (Image *)CONCAT17(colorCount_,
                               CONCAT16(in_stack_ffffffffffffff16,
                                        CONCAT24(in_stack_ffffffffffffff14,uVar4))));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2e3b);
  (*local_8)(&local_48,&stack0xffffffffffffff58,bVar1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffffe0,
             (ulong)bVar1);
  bVar2 = Unit_Test::verifyImage
                    ((Image *)CONCAT17(colorCount_,
                                       CONCAT16(in_stack_ffffffffffffff16,
                                                CONCAT24(in_stack_ffffffffffffff14,uVar4))),uVar3);
  local_f6 = false;
  if (bVar2) {
    uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount
                      ((ImageTemplate<unsigned_char> *)&stack0xffffffffffffff58);
    local_f6 = uVar3 == '\x01';
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2ec3);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1d2ed0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  return local_f6;
}

Assistant:

bool form2_ExtractChannel(ExtractChannelForm2 ExtractChannel)
    {
        const std::vector < uint8_t > intensity = intensityArray( 3 );
        PenguinV_Image::Image input = uniformRGBImage( intensity[0] );
        fillImage( input, 0, 0, input.width(), input.height(), intensity );

        const uint8_t channelId = randomValue<uint8_t>( 3 );
        PenguinV_Image::Image output = uniformImage( input.width(), input.height() );

        ExtractChannel( input, output, channelId );

        return verifyImage( output, intensity[channelId] ) && (output.colorCount() == PenguinV_Image::GRAY_SCALE);
    }